

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O2

shared_ptr<ITest> __thiscall
injection::injection_private::InjectionEngine<ITest>::config
          (InjectionEngine<ITest> *this,function<ITest_*()> *creationFunction,InjectionCommand cmd,
          InjectionScope scope)

{
  int iVar1;
  __shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  shared_ptr<ITest> *psVar4;
  shared_ptr<ITest> sVar5;
  shared_ptr<ITest> instance;
  shared_ptr<ITest> local_38;
  
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_00000014,cmd);
  if (config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
      ::maker == '\0') {
    iVar1 = __cxa_guard_acquire(&config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
                                 ::maker);
    _Var3._M_pi = extraout_RDX_01;
    if (iVar1 != 0) {
      config::maker.super__Function_base._M_manager = (_Manager_type)0x0;
      config::maker._M_invoker = (_Invoker_type)0x0;
      config::maker.super__Function_base._M_functor = (_Any_data)ZEXT816(0);
      __cxa_atexit(std::_Function_base::~_Function_base,&config::maker,&__dso_handle);
      __cxa_guard_release(&config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
                           ::maker);
      _Var3._M_pi = extraout_RDX_02;
    }
  }
  if (config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
      ::shared == '\0') {
    iVar1 = __cxa_guard_acquire(&config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
                                 ::shared);
    _Var3._M_pi = extraout_RDX_03;
    if (iVar1 != 0) {
      __cxa_atexit(std::__shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &config::shared,&__dso_handle);
      __cxa_guard_release(&config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
                           ::shared);
      _Var3._M_pi = extraout_RDX_04;
    }
  }
  if (cmd != GET) {
    if (cmd == SET) {
      config::scopeType = scope;
      std::function<ITest_*()>::operator=(&config::maker,creationFunction);
      if (scope == SINGLETON_EAGER) {
        set(&config::shared,&config::maker);
      }
      else {
        std::__shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>::reset
                  (&config::shared.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>);
      }
    }
    goto LAB_0010b717;
  }
  if (config::scopeType == TRANSIENT) {
    local_38.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_38.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = &set(&local_38,&config::maker)->super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var3._M_pi = extraout_RDX_00;
    goto LAB_0010b726;
  }
  if (config::scopeType == SINGLETON) {
    if (config::shared.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) goto LAB_0010b717;
    psVar4 = set(&config::shared,&config::maker);
  }
  else {
    if (config::scopeType != SINGLETON_EAGER) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      goto LAB_0010b726;
    }
LAB_0010b717:
    psVar4 = &config::shared;
  }
  std::__shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2> *)this,
             &psVar4->super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>);
  _Var3._M_pi = extraout_RDX;
LAB_0010b726:
  sVar5.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ITest>)sVar5.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<I> config(std::function<I*(void)> creationFunction, InjectionCommand cmd, InjectionScope scope = InjectionScope::INVALID) {

        static std::function<I*(void)> maker;
        static InjectionScope scopeType = InjectionScope::INVALID;
        static std::shared_ptr<I> shared;

        switch(cmd) {
            case InjectionCommand::SET:
                scopeType = scope;
                maker = creationFunction;
                if (scope == InjectionScope::SINGLETON_EAGER) {
                    set(shared, maker);
                } else {
                    shared.reset();
                }

                break;
            case InjectionCommand::GET:
                switch(scopeType) {
                    case InjectionScope::SINGLETON_EAGER:
                        return shared;
                    case InjectionScope::SINGLETON:
                        if (shared) {
                            return shared;
                        }
                    return set(shared, maker);

                case InjectionScope::TRANSIENT: {
                        std::shared_ptr<I> instance;
                        return set(instance, maker);
                    }
                default:
                        return std::shared_ptr<I>();
                }

        }
        return shared;
    }